

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_com.c
# Opt level: O3

void hal_record_scaling_list(scalingFactor_t *pScalingFactor_out,scalingList_t *pScalingList)

{
  RK_U8 (*paRVar1) [64];
  bool bVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  RK_U8 *pRVar10;
  scalingList_t *psVar11;
  uint uVar12;
  RK_U8 *pRVar13;
  ulong uVar14;
  RK_U8 (*paaRVar15) [6] [64];
  scalingList_t *psVar16;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  RK_U8 tmpBuf [64];
  
  lVar3 = 0;
  uVar12 = 0;
  psVar11 = pScalingList;
  do {
    iVar9 = (&DAT_002a0580)[lVar3];
    lVar6 = 0x40;
    if (lVar3 == 0) {
      lVar6 = 0x10;
    }
    uVar14 = 0;
    paaRVar15 = pScalingList->sl + 3;
    psVar16 = psVar11;
    do {
      lVar8 = 0;
      if (lVar3 == 3) {
        do {
          pScalingFactor_out->scalingfactor0[uVar12 + (int)lVar8] = (*paaRVar15)[0][lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x40);
        uVar12 = uVar12 + 0x40;
        iVar7 = 0x80;
        do {
          uVar5 = (ulong)uVar12;
          uVar12 = uVar12 + 1;
          pScalingFactor_out->scalingfactor0[uVar5] = '\0';
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      else {
        do {
          pScalingFactor_out->scalingfactor0[uVar12 + (int)lVar8] = psVar16->sl[0][0][lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
        uVar12 = uVar12 + (int)lVar8;
      }
      uVar14 = uVar14 + 1;
      psVar16 = (scalingList_t *)(psVar16->sl[0] + 1);
      paaRVar15 = (RK_U8 (*) [6] [64])(*paaRVar15 + 1);
    } while (uVar14 != iVar9 + (uint)(iVar9 == 0));
    lVar3 = lVar3 + 1;
    psVar11 = (scalingList_t *)(psVar11->sl + 1);
  } while (lVar3 != 4);
  lVar3 = 0;
  iVar9 = 0;
  do {
    paRVar1 = pScalingList->sl[0] + lVar3;
    local_78 = *(undefined8 *)*paRVar1;
    uStack_70 = *(undefined8 *)(*paRVar1 + 8);
    lVar6 = -0x10;
    pRVar13 = (RK_U8 *)((long)&uStack_70 + 4);
    do {
      iVar7 = (int)lVar6;
      pScalingFactor_out->scalingfactor1[iVar9 + iVar7 + 0x10] = pRVar13[-0xc];
      pScalingFactor_out->scalingfactor1[(uint)(iVar9 + 0x11 + iVar7)] = pRVar13[-8];
      pScalingFactor_out->scalingfactor1[(uint)(iVar9 + 0x12 + iVar7)] = pRVar13[-4];
      pScalingFactor_out->scalingfactor1[(uint)(iVar9 + 0x13 + iVar7)] = *pRVar13;
      pRVar13 = pRVar13 + 1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0);
    lVar3 = lVar3 + 1;
    iVar9 = iVar9 + 0x10;
  } while (lVar3 != 6);
  lVar3 = 0;
  do {
    pScalingFactor_out->scalingdc[lVar3] = pScalingList->sl_dc[0][lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  pRVar13 = pScalingFactor_out->scalingdc + 8;
  lVar3 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    pRVar13[-2] = pScalingList->sl_dc[1][lVar3];
    pRVar13[-1] = '\0';
    pRVar13[0] = '\0';
    pRVar13 = pRVar13 + 3;
    lVar3 = 1;
    bVar2 = false;
  } while (bVar4);
  pScalingFactor_out->reserverd[0] = '\0';
  pScalingFactor_out->reserverd[1] = '\0';
  pScalingFactor_out->reserverd[2] = '\0';
  pScalingFactor_out->reserverd[3] = '\0';
  pRVar13 = pScalingFactor_out->scalingfactor0 + 3;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar6) = pRVar13[lVar6 * 4 + -3];
      *(RK_U8 *)((long)&local_78 + lVar6 + 4) = pRVar13[lVar6 * 4 + -2];
      *(RK_U8 *)((long)&uStack_70 + lVar6) = pRVar13[lVar6 * 4 + -1];
      *(RK_U8 *)((long)&uStack_70 + lVar6 + 4) = pRVar13[lVar6 * 4];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    *(undefined8 *)(pScalingFactor_out->scalingfactor0 + lVar3 * 0x10) = local_78;
    *(undefined8 *)(pScalingFactor_out->scalingfactor0 + lVar3 * 0x10 + 8) = uStack_70;
    lVar3 = lVar3 + 1;
    pRVar13 = pRVar13 + 0x10;
  } while (lVar3 != 6);
  pRVar13 = pScalingFactor_out->scalingfactor0 + 0x67;
  lVar3 = 0;
  do {
    pRVar10 = pScalingFactor_out->scalingfactor0 + lVar3 * 0x40 + 0x60;
    lVar6 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar6) = pRVar13[lVar6 * 8 + -7];
      *(RK_U8 *)((long)&uStack_70 + lVar6) = pRVar13[lVar6 * 8 + -6];
      *(RK_U8 *)((long)&local_68 + lVar6) = pRVar13[lVar6 * 8 + -5];
      *(RK_U8 *)((long)&uStack_60 + lVar6) = pRVar13[lVar6 * 8 + -4];
      *(RK_U8 *)((long)&local_58 + lVar6) = pRVar13[lVar6 * 8 + -3];
      tmpBuf[lVar6 + -8] = pRVar13[lVar6 * 8 + -2];
      tmpBuf[lVar6] = pRVar13[lVar6 * 8 + -1];
      tmpBuf[lVar6 + 8] = pRVar13[lVar6 * 8];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    *(undefined8 *)(pRVar10 + 0x30) = tmpBuf._0_8_;
    *(undefined8 *)(pRVar10 + 0x38) = tmpBuf._8_8_;
    *(undefined8 *)(pRVar10 + 0x20) = local_58;
    *(undefined8 *)(pRVar10 + 0x28) = uStack_50;
    *(undefined8 *)(pRVar10 + 0x10) = local_68;
    *(undefined8 *)(pRVar10 + 0x18) = uStack_60;
    *(undefined8 *)pRVar10 = local_78;
    *(undefined8 *)(pRVar10 + 8) = uStack_70;
    lVar3 = lVar3 + 1;
    pRVar13 = pRVar13 + 0x40;
  } while (lVar3 != 6);
  pRVar13 = pScalingFactor_out->scalingfactor0 + 0x1e7;
  lVar3 = 0;
  do {
    pRVar10 = pScalingFactor_out->scalingfactor0 + lVar3 * 0x40 + 0x1e0;
    lVar6 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar6) = pRVar13[lVar6 * 8 + -7];
      *(RK_U8 *)((long)&uStack_70 + lVar6) = pRVar13[lVar6 * 8 + -6];
      *(RK_U8 *)((long)&local_68 + lVar6) = pRVar13[lVar6 * 8 + -5];
      *(RK_U8 *)((long)&uStack_60 + lVar6) = pRVar13[lVar6 * 8 + -4];
      *(RK_U8 *)((long)&local_58 + lVar6) = pRVar13[lVar6 * 8 + -3];
      tmpBuf[lVar6 + -8] = pRVar13[lVar6 * 8 + -2];
      tmpBuf[lVar6] = pRVar13[lVar6 * 8 + -1];
      tmpBuf[lVar6 + 8] = pRVar13[lVar6 * 8];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    *(undefined8 *)(pRVar10 + 0x30) = tmpBuf._0_8_;
    *(undefined8 *)(pRVar10 + 0x38) = tmpBuf._8_8_;
    *(undefined8 *)(pRVar10 + 0x20) = local_58;
    *(undefined8 *)(pRVar10 + 0x28) = uStack_50;
    *(undefined8 *)(pRVar10 + 0x10) = local_68;
    *(undefined8 *)(pRVar10 + 0x18) = uStack_60;
    *(undefined8 *)pRVar10 = local_78;
    *(undefined8 *)(pRVar10 + 8) = uStack_70;
    lVar3 = lVar3 + 1;
    pRVar13 = pRVar13 + 0x40;
  } while (lVar3 != 6);
  pRVar13 = pScalingFactor_out->scalingfactor0 + 0x367;
  lVar3 = 0;
  do {
    pRVar10 = pScalingFactor_out->scalingfactor0 + lVar3 * 0x40 + 0x360;
    lVar6 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar6) = pRVar13[lVar6 * 8 + -7];
      *(RK_U8 *)((long)&uStack_70 + lVar6) = pRVar13[lVar6 * 8 + -6];
      *(RK_U8 *)((long)&local_68 + lVar6) = pRVar13[lVar6 * 8 + -5];
      *(RK_U8 *)((long)&uStack_60 + lVar6) = pRVar13[lVar6 * 8 + -4];
      *(RK_U8 *)((long)&local_58 + lVar6) = pRVar13[lVar6 * 8 + -3];
      tmpBuf[lVar6 + -8] = pRVar13[lVar6 * 8 + -2];
      tmpBuf[lVar6] = pRVar13[lVar6 * 8 + -1];
      tmpBuf[lVar6 + 8] = pRVar13[lVar6 * 8];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    *(undefined8 *)(pRVar10 + 0x30) = tmpBuf._0_8_;
    *(undefined8 *)(pRVar10 + 0x38) = tmpBuf._8_8_;
    *(undefined8 *)(pRVar10 + 0x20) = local_58;
    *(undefined8 *)(pRVar10 + 0x28) = uStack_50;
    *(undefined8 *)(pRVar10 + 0x10) = local_68;
    *(undefined8 *)(pRVar10 + 0x18) = uStack_60;
    *(undefined8 *)pRVar10 = local_78;
    *(undefined8 *)(pRVar10 + 8) = uStack_70;
    lVar3 = lVar3 + 1;
    pRVar13 = pRVar13 + 0x40;
  } while (lVar3 != 6);
  pRVar13 = pScalingFactor_out->scalingfactor1 + 3;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar6) = pRVar13[lVar6 * 4 + -3];
      *(RK_U8 *)((long)&local_78 + lVar6 + 4) = pRVar13[lVar6 * 4 + -2];
      *(RK_U8 *)((long)&uStack_70 + lVar6) = pRVar13[lVar6 * 4 + -1];
      *(RK_U8 *)((long)&uStack_70 + lVar6 + 4) = pRVar13[lVar6 * 4];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    *(undefined8 *)(pScalingFactor_out->scalingfactor1 + lVar3 * 0x10) = local_78;
    *(undefined8 *)(pScalingFactor_out->scalingfactor1 + lVar3 * 0x10 + 8) = uStack_70;
    lVar3 = lVar3 + 1;
    pRVar13 = pRVar13 + 0x10;
  } while (lVar3 != 6);
  return;
}

Assistant:

void hal_record_scaling_list(scalingFactor_t *pScalingFactor_out, scalingList_t *pScalingList)
{
    RK_S32 i;
    RK_U32 g_scalingListNum_model[SCALING_LIST_SIZE_NUM] = {6, 6, 6, 2}; // from C Model
    RK_U32 nIndex = 0;
    RK_U32 sizeId, matrixId, listId;
    RK_U8 *p = pScalingFactor_out->scalingfactor0;
    RK_U8 tmpBuf[8 * 8];

    //output non-default scalingFactor Table (1248 BYTES)
    for (sizeId = 0; sizeId < SCALING_LIST_SIZE_NUM; sizeId++) {
        for (listId = 0; listId < g_scalingListNum_model[sizeId]; listId++) {
            if (sizeId < 3) {
                for (i = 0; i < (sizeId == 0 ? 16 : 64); i++) {
                    pScalingFactor_out->scalingfactor0[nIndex++] = (RK_U8)pScalingList->sl[sizeId][listId][i];
                }
            } else {
                for (i = 0; i < 64; i ++) {
                    pScalingFactor_out->scalingfactor0[nIndex++] = (RK_U8)pScalingList->sl[sizeId][listId][i];
                }
                for (i = 0; i < 128; i ++) {
                    pScalingFactor_out->scalingfactor0[nIndex++] = 0;
                }
            }
        }
    }
    //output non-default scalingFactor Table Rotation(96 Bytes)
    nIndex = 0;
    for (listId = 0; listId < g_scalingListNum_model[0]; listId++) {
        RK_U8 temp16[16] = {0};
        for (i = 0; i < 16; i ++) {
            temp16[i] = (RK_U8)pScalingList->sl[0][listId][i];
        }
        for (i = 0; i < 4; i ++) {
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i];
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i + 4];
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i + 8];
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i + 12];
        }
    }
    //output non-default ScalingList_DC_Coeff (12 BYTES)
    nIndex = 0;
    for (listId = 0; listId < g_scalingListNum_model[2]; listId++) { //sizeId = 2
        pScalingFactor_out->scalingdc[nIndex++] = (RK_U8)pScalingList->sl_dc[0][listId];// zrh warning: sl_dc differed from scalingList->getScalingListDC
    }
    for (listId = 0; listId < g_scalingListNum_model[3]; listId++) { //sizeId = 3
        pScalingFactor_out->scalingdc[nIndex++] = (RK_U8)pScalingList->sl_dc[1][listId];// zrh warning: sl_dc differed from scalingList->getScalingListDC
        pScalingFactor_out->scalingdc[nIndex++] = 0;
        pScalingFactor_out->scalingdc[nIndex++] = 0;
    }

    //align 16X address
    nIndex = 0;
    for (i = 0; i < 4; i ++) {
        pScalingFactor_out->reserverd[nIndex++] = 0;
    }

    //----------------------All above code show the normal store way in HM--------------------------
    //--------from now on, the scalingfactor0 is rotated 90', the scalingfactor1 is also rotated 90'

    //sizeId == 0
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + matrixId * 16;

        for (i = 0; i < 4; i++) {
            tmpBuf[4 * 0 + i] = p[i * 4 + 0];
            tmpBuf[4 * 1 + i] = p[i * 4 + 1];
            tmpBuf[4 * 2 + i] = p[i * 4 + 2];
            tmpBuf[4 * 3 + i] = p[i * 4 + 3];
        }
        memcpy(p, tmpBuf, 4 * 4 * sizeof(RK_U8));
    }
    //sizeId == 1
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + 6 * 16 + matrixId * 64;

        for (i = 0; i < 8; i++) {
            tmpBuf[8 * 0 + i] = p[i * 8 + 0];
            tmpBuf[8 * 1 + i] = p[i * 8 + 1];
            tmpBuf[8 * 2 + i] = p[i * 8 + 2];
            tmpBuf[8 * 3 + i] = p[i * 8 + 3];
            tmpBuf[8 * 4 + i] = p[i * 8 + 4];
            tmpBuf[8 * 5 + i] = p[i * 8 + 5];
            tmpBuf[8 * 6 + i] = p[i * 8 + 6];
            tmpBuf[8 * 7 + i] = p[i * 8 + 7];
        }
        memcpy(p, tmpBuf, 8 * 8 * sizeof(RK_U8));
    }
    //sizeId == 2
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + 6 * 16 + 6 * 64 + matrixId * 64;

        for (i = 0; i < 8; i++) {
            tmpBuf[8 * 0 + i] = p[i * 8 + 0];
            tmpBuf[8 * 1 + i] = p[i * 8 + 1];
            tmpBuf[8 * 2 + i] = p[i * 8 + 2];
            tmpBuf[8 * 3 + i] = p[i * 8 + 3];
            tmpBuf[8 * 4 + i] = p[i * 8 + 4];
            tmpBuf[8 * 5 + i] = p[i * 8 + 5];
            tmpBuf[8 * 6 + i] = p[i * 8 + 6];
            tmpBuf[8 * 7 + i] = p[i * 8 + 7];
        }
        memcpy(p, tmpBuf, 8 * 8 * sizeof(RK_U8));
    }
    //sizeId == 3
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + 6 * 16 + 6 * 64 + 6 * 64 + matrixId * 64;

        for (i = 0; i < 8; i++) {
            tmpBuf[8 * 0 + i] = p[i * 8 + 0];
            tmpBuf[8 * 1 + i] = p[i * 8 + 1];
            tmpBuf[8 * 2 + i] = p[i * 8 + 2];
            tmpBuf[8 * 3 + i] = p[i * 8 + 3];
            tmpBuf[8 * 4 + i] = p[i * 8 + 4];
            tmpBuf[8 * 5 + i] = p[i * 8 + 5];
            tmpBuf[8 * 6 + i] = p[i * 8 + 6];
            tmpBuf[8 * 7 + i] = p[i * 8 + 7];
        }
        memcpy(p, tmpBuf, 8 * 8 * sizeof(RK_U8));
    }

    //sizeId == 0
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor1 + matrixId * 16;

        for (i = 0; i < 4; i++) {
            tmpBuf[4 * 0 + i] = p[i * 4 + 0];
            tmpBuf[4 * 1 + i] = p[i * 4 + 1];
            tmpBuf[4 * 2 + i] = p[i * 4 + 2];
            tmpBuf[4 * 3 + i] = p[i * 4 + 3];
        }
        memcpy(p, tmpBuf, 4 * 4 * sizeof(RK_U8));
    }
}